

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.h
# Opt level: O2

shared_ptr<Token> __thiscall Lexer::scan(Lexer *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  iterator iVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  int iVar7;
  Lexer *in_RSI;
  shared_ptr<Word> *__r;
  char cVar8;
  shared_ptr<Token> sVar9;
  float local_200;
  float local_1fc;
  key_type local_1f8;
  shared_ptr<Word> w;
  stringstream ss;
  undefined7 uStack_1b7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1b0;
  ostream local_1a8 [376];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  
  do {
    bVar1 = in_RSI->peek;
    uVar4 = (uint)bVar1;
    if (bVar1 != 9) {
      if (bVar1 == 10) {
        line = line + 1;
      }
      else if ((bVar1 != 0xd) && (bVar1 != 0x20)) break;
    }
    readch(in_RSI);
  } while( true );
  if (bVar1 == 0x21) {
    bVar2 = readch(in_RSI,'=');
    if (!bVar2) {
      _ss = CONCAT71(uStack_1b7,0x21);
LAB_00107a90:
      sVar9 = std::make_shared<Token,char>(&this->peek);
      _Var6 = sVar9.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      goto LAB_00107a98;
    }
    __r = &Word::Ne;
  }
  else if (bVar1 == 0x26) {
    bVar2 = readch(in_RSI,'&');
    if (!bVar2) {
      _ss = CONCAT71(uStack_1b7,0x26);
      goto LAB_00107a90;
    }
    __r = &Word::And;
  }
  else if (bVar1 == 0x3c) {
    bVar2 = readch(in_RSI,'=');
    if (!bVar2) {
      _ss = CONCAT71(uStack_1b7,0x3c);
      goto LAB_00107a90;
    }
    __r = &Word::Le;
  }
  else if (bVar1 == 0x3d) {
    bVar2 = readch(in_RSI,'=');
    if (!bVar2) {
      _ss = CONCAT71(uStack_1b7,0x3d);
      goto LAB_00107a90;
    }
    __r = &Word::Eq;
  }
  else if (bVar1 == 0x3e) {
    bVar2 = readch(in_RSI,'=');
    if (!bVar2) {
      _ss = CONCAT71(uStack_1b7,0x3e);
      goto LAB_00107a90;
    }
    __r = &Word::Ge;
  }
  else {
    if (bVar1 != 0x7c) {
      if ((int)(char)bVar1 - 0x30U < 10) {
        iVar7 = 0;
        do {
          iVar3 = toDigit(in_RSI,(char)uVar4);
          iVar7 = iVar3 + iVar7 * 10;
          readch(in_RSI);
          uVar4 = (uint)in_RSI->peek;
        } while (uVar4 - 0x30 < 10);
        local_1f8._M_dataplus._M_p._0_4_ = iVar7;
        if (in_RSI->peek == '.') {
          local_200 = (float)iVar7;
          local_1fc = 10.0;
          while( true ) {
            readch(in_RSI);
            if (9 < (int)in_RSI->peek - 0x30U) break;
            iVar7 = toDigit(in_RSI,in_RSI->peek);
            local_200 = local_200 + (float)iVar7 / local_1fc;
            local_1fc = local_1fc * 10.0;
          }
          w.super___shared_ptr<Word,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               CONCAT44(w.super___shared_ptr<Word,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,
                        local_200);
          std::make_shared<Real,float&>((float *)&ss);
        }
        else {
          std::make_shared<Num,int&>((int *)&ss);
        }
        _Var6._M_pi = _Stack_1b0._M_pi;
        _Stack_1b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        *(undefined8 *)this = _ss;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->words)._M_t._M_impl = _Var6._M_pi;
        _ss = 0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1b0);
        _Var6._M_pi = extraout_RDX_00;
      }
      else {
        iVar7 = isalpha((int)(char)bVar1);
        if (iVar7 == 0) {
          sVar9 = std::make_shared<Token,char&>(&this->peek);
          _Var6 = sVar9.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          in_RSI->peek = ' ';
        }
        else {
          std::__cxx11::stringstream::stringstream((stringstream *)&ss);
          cVar8 = in_RSI->peek;
          do {
            std::operator<<(local_1a8,cVar8);
            readch(in_RSI);
            cVar8 = in_RSI->peek;
            iVar7 = isalpha((int)cVar8);
          } while ((int)cVar8 - 0x30U < 10 || iVar7 != 0);
          std::__cxx11::stringbuf::str();
          iVar5 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Word>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Word>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Word>_>_>_>
                  ::find(&(in_RSI->words)._M_t,&local_1f8);
          std::__cxx11::string::~string((string *)&local_1f8);
          if ((_Rb_tree_header *)iVar5._M_node ==
              &(in_RSI->words)._M_t._M_impl.super__Rb_tree_header) {
            std::__cxx11::stringbuf::str();
            std::make_shared<Word,std::__cxx11::string,Tag>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&w,
                       (Tag *)&local_1f8);
            std::__cxx11::string::~string((string *)&local_1f8);
            std::__cxx11::stringbuf::str();
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<Word>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<Word>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<Word>>>>
            ::_M_emplace_unique<std::__cxx11::string,std::shared_ptr<Word>&>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<Word>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<Word>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<Word>>>>
                        *)&in_RSI->words,&local_1f8,&w);
            std::__cxx11::string::~string((string *)&local_1f8);
            _Var6 = w.super___shared_ptr<Word,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
            w.super___shared_ptr<Word,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            *(element_type **)this = w.super___shared_ptr<Word,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->words)._M_t._M_impl =
                 _Var6._M_pi;
            w.super___shared_ptr<Word,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&w.super___shared_ptr<Word,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          }
          else {
            std::__shared_ptr<Token,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Word,void>
                      ((__shared_ptr<Token,(__gnu_cxx::_Lock_policy)2> *)this,
                       (__shared_ptr<Word,_(__gnu_cxx::_Lock_policy)2> *)(iVar5._M_node + 2));
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
          _Var6._M_pi = extraout_RDX_01;
        }
      }
      goto LAB_00107a98;
    }
    bVar2 = readch(in_RSI,'\"');
    if (!bVar2) {
      _ss = CONCAT71(uStack_1b7,0x7c);
      goto LAB_00107a90;
    }
    __r = &Word::Or;
  }
  std::__shared_ptr<Token,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Word,void>
            ((__shared_ptr<Token,(__gnu_cxx::_Lock_policy)2> *)this,
             &__r->super___shared_ptr<Word,_(__gnu_cxx::_Lock_policy)2>);
  _Var6._M_pi = extraout_RDX;
LAB_00107a98:
  sVar9.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var6._M_pi;
  sVar9.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Token>)sVar9.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Token> scan() {

		// Skip whitespace characters
		for (;; readch()) {
			if (peek == ' ' || peek == '\t' || peek == '\r') continue;
			else if (peek == '\n') line++;
			else break;
		}

		// Recognize complex tokens that consist of two or more characters
		switch (peek)
		{
		case '&':
			if (readch('&')) return Word::And;
			else return std::make_shared<Token>('&');
			break;
		case '|':
			if (readch('"')) return Word::Or;
			else return std::make_shared<Token>('|');
			break;
		case '=':
			if (readch('=')) return Word::Eq;
			else return std::make_shared<Token>('=');
			break;
		case '!':
			if (readch('=')) return Word::Ne;
			else return std::make_shared<Token>('!');
			break;
		case '<':
			if (readch('=')) return Word::Le;
			else return std::make_shared<Token>('<');
			break;
		case '>':
			if (readch('=')) return Word::Ge;
			else return std::make_shared<Token>('>');
			break;
		default:
			break;
		}

		// Number recognition
		if (std::isdigit(peek)) {
			int v = 0;
			do {
				v = v * 10 + toDigit(peek); readch();
			} while (std::isdigit(peek));

			if (peek != '.') return  std::make_shared<Num>(v);
			float x = (float)v; float d = 10.f;

			for (;;) {
				readch();
				if (!std::isdigit(peek)) break;
				x += toDigit(peek) / d; d *= 10;
			}
			return std::make_shared<Real>(x);
		}

		// String recognition
		if (std::isalpha(peek)) {
			std::stringstream ss;
			do {
				ss << peek; readch();
			} while (std::isalpha(peek) || std::isdigit(peek));
			auto result = words.find(ss.str());
			if (result != words.end()) return result->second;
			std::shared_ptr<Word> w = std::make_shared<Word>(ss.str(), ID);
			words.emplace(ss.str(), w);
			return w;
		}

		// Other tokens recognition
		std::shared_ptr<Token> t = std::make_shared<Token>(peek);
		peek = ' ';
		return t;
	}